

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall Server::~Server(Server *this)

{
  Client *pCVar1;
  bool bVar2;
  reference ppCVar3;
  pointer piVar4;
  Client *client;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  Server *this_local;
  
  this->_vptr_Server = (_func_int **)&PTR_ClientFactory_002c5bc0;
  __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(&this->clients);
  client = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(&this->clients);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&client);
    if (!bVar2) break;
    ppCVar3 = std::_List_iterator<Client_*>::operator*(&__end1);
    pCVar1 = *ppCVar3;
    piVar4 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                       (&pCVar1->impl);
    close(piVar4->sock);
    if (pCVar1 != (Client *)0x0) {
      (*pCVar1->_vptr_Client[2])();
    }
    std::_List_iterator<Client_*>::operator++(&__end1);
  }
  close(this->impl->sock);
  if (this->impl != (impl_ *)0x0) {
    operator_delete(this->impl,0x188);
  }
  std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::~list(&this->clients);
  return;
}

Assistant:

Server::~Server()
{
	UTIL_FOREACH(this->clients, client)
	{
#ifdef WIN32
		closesocket(client->impl->sock);
#else // WIN32
		close(client->impl->sock);
#endif // WIN32
		delete client;
	}

#ifdef WIN32
	closesocket(this->impl->sock);
#else // WIN32
	close(this->impl->sock);
#endif // WIN32

	delete this->impl;
}